

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_METAL_SGN(Context *ctx)

{
  size_t in_R8;
  char src0 [64];
  char code [128];
  char acStack_d8 [64];
  char local_98 [128];
  
  make_METAL_srcarg_string(ctx,0,(ctx->dest_arg).writemask,acStack_d8,in_R8);
  ctx->metal_need_header_common = 1;
  make_METAL_destarg_assign(ctx,local_98,0x80,"sign(%s)",acStack_d8);
  output_line(ctx,"%s",local_98);
  return;
}

Assistant:

static void emit_METAL_SGN(Context *ctx)
{
    // (we don't need the temporary registers specified for the D3D opcode.)
    char src0[64]; make_METAL_srcarg_string_masked(ctx, 0, src0, sizeof (src0));
    char code[128];
    ctx->metal_need_header_common = 1;
    make_METAL_destarg_assign(ctx, code, sizeof (code), "sign(%s)", src0);
    output_line(ctx, "%s", code);
}